

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O1

void av1_global_motion_estimation_mt(AV1_COMP *cpi)

{
  EncWorkerData *pEVar1;
  AVxWorker *pAVar2;
  undefined1 *puVar3;
  MultiThreadInfo *pMVar4;
  AV1GlobalMotionSync *pAVar5;
  uint uVar6;
  int iVar7;
  uint8_t *puVar8;
  int *piVar9;
  AVxWorkerInterface *pAVar10;
  ulong uVar11;
  char cVar12;
  char *pcVar13;
  int iVar14;
  ThreadData_conflict *pTVar15;
  uint uVar16;
  ulong uVar17;
  AVxWorker *pAVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  aom_internal_error_info error_info;
  aom_internal_error_info local_1d0;
  
  pAVar5 = &(cpi->mt_info).gm_sync;
  (pAVar5->job_info).thread_id_to_dir[0x30] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0x31] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0x32] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0x33] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0x34] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0x35] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0x36] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0x37] = '\0';
  pAVar5 = &(cpi->mt_info).gm_sync;
  (pAVar5->job_info).thread_id_to_dir[0x38] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0x39] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0x3a] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0x3b] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0x3c] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0x3d] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0x3e] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0x3f] = '\0';
  pAVar5 = &(cpi->mt_info).gm_sync;
  (pAVar5->job_info).thread_id_to_dir[0x20] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0x21] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0x22] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0x23] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0x24] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0x25] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0x26] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0x27] = '\0';
  pAVar5 = &(cpi->mt_info).gm_sync;
  (pAVar5->job_info).thread_id_to_dir[0x28] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0x29] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0x2a] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0x2b] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0x2c] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0x2d] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0x2e] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0x2f] = '\0';
  pAVar5 = &(cpi->mt_info).gm_sync;
  (pAVar5->job_info).thread_id_to_dir[0x10] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0x11] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0x12] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0x13] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0x14] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0x15] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0x16] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0x17] = '\0';
  pAVar5 = &(cpi->mt_info).gm_sync;
  (pAVar5->job_info).thread_id_to_dir[0x18] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0x19] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0x1a] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0x1b] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0x1c] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0x1d] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0x1e] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0x1f] = '\0';
  pMVar4 = &cpi->mt_info;
  (pMVar4->gm_sync).job_info.thread_id_to_dir[0] = '\0';
  (pMVar4->gm_sync).job_info.thread_id_to_dir[1] = '\0';
  (pMVar4->gm_sync).job_info.thread_id_to_dir[2] = '\0';
  (pMVar4->gm_sync).job_info.thread_id_to_dir[3] = '\0';
  (pMVar4->gm_sync).job_info.thread_id_to_dir[4] = '\0';
  (pMVar4->gm_sync).job_info.thread_id_to_dir[5] = '\0';
  (pMVar4->gm_sync).job_info.thread_id_to_dir[6] = '\0';
  (pMVar4->gm_sync).job_info.thread_id_to_dir[7] = '\0';
  pAVar5 = &(cpi->mt_info).gm_sync;
  (pAVar5->job_info).thread_id_to_dir[8] = '\0';
  (pAVar5->job_info).thread_id_to_dir[9] = '\0';
  (pAVar5->job_info).thread_id_to_dir[10] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0xb] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0xc] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0xd] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0xe] = '\0';
  (pAVar5->job_info).thread_id_to_dir[0xf] = '\0';
  (cpi->mt_info).gm_sync.job_info.early_exit[0] = '\0';
  (cpi->mt_info).gm_sync.job_info.early_exit[1] = '\0';
  (cpi->mt_info).gm_sync.job_info.next_frame_to_process[0] = '\0';
  (cpi->mt_info).gm_sync.job_info.next_frame_to_process[1] = '\0';
  uVar6 = (cpi->gm_info).num_ref_frames[1] + (cpi->gm_info).num_ref_frames[0];
  uVar16 = 2;
  if ((int)uVar6 < 2) {
    uVar16 = uVar6;
  }
  if ((cpi->sf).gm_sf.prune_ref_frame_for_gm_search == 0) {
    uVar16 = uVar6;
  }
  uVar6 = (cpi->mt_info).num_workers;
  if ((int)uVar6 <= (int)uVar16) {
    uVar16 = uVar6;
  }
  uVar17 = (ulong)uVar16;
  if ((int)uVar16 < 1) {
    (cpi->mt_info).gm_sync.gm_mt_exit = false;
  }
  else {
    uVar11 = 0;
    cVar12 = '\0';
    do {
      (cpi->mt_info).gm_sync.job_info.thread_id_to_dir[uVar11] = cVar12;
      cVar12 = cVar12 + '\x01';
      if (cVar12 == '\x02') {
        cVar12 = '\0';
      }
      uVar11 = uVar11 + 1;
    } while (uVar17 != uVar11);
    (cpi->mt_info).gm_sync.gm_mt_exit = false;
    if (0 < (int)uVar16) {
      lVar20 = uVar17 + 1;
      lVar21 = uVar17 * 0x1d0;
      lVar19 = uVar17 * 0x38;
      uVar6 = uVar16;
      do {
        uVar6 = uVar6 - 1;
        pAVar18 = (cpi->mt_info).workers;
        pEVar1 = (cpi->mt_info).tile_thr_data;
        pcVar13 = pEVar1[-1].error_info.detail + lVar21 + -0x20;
        *(code **)((long)pAVar18 + lVar19 + -0x20) = gm_mt_worker_hook;
        *(char **)((long)pAVar18 + lVar19 + -0x18) = pcVar13;
        *(undefined8 *)((long)pAVar18 + lVar19 + -0x10) = 0;
        *(uint *)((pEVar1->error_info).detail + lVar21 + -0x24) = uVar6;
        *(uint *)((pEVar1->error_info).detail + lVar21 + -0x28) = uVar6;
        *(AV1_COMP **)pcVar13 = cpi;
        pTVar15 = &cpi->td;
        if (lVar21 != 0x1d0) {
          pTVar15 = *(ThreadData_conflict **)((long)pEVar1 + lVar21 + -0x1c0);
        }
        *(ThreadData_conflict **)((long)pEVar1 + lVar21 + -0x1c8) = pTVar15;
        if (pTVar15 != &cpi->td) {
          puVar8 = (uint8_t *)
                   aom_malloc((long)(cpi->gm_info).segment_map_h *
                              (long)(cpi->gm_info).segment_map_w);
          (pTVar15->gm_data).segment_map = puVar8;
          if (puVar8 == (uint8_t *)0x0) {
            aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                               "Failed to allocate gm_data->segment_map");
          }
          (pTVar15->gm_data).motion_models[0].inliers = (int *)0x0;
          *(undefined8 *)&(pTVar15->gm_data).motion_models[0].num_inliers = 0;
          (pTVar15->gm_data).motion_models[0].params[4] = 0.0;
          (pTVar15->gm_data).motion_models[0].params[5] = 0.0;
          (pTVar15->gm_data).motion_models[0].params[2] = 0.0;
          (pTVar15->gm_data).motion_models[0].params[3] = 0.0;
          (pTVar15->gm_data).motion_models[0].params[0] = 0.0;
          (pTVar15->gm_data).motion_models[0].params[1] = 0.0;
          piVar9 = (int *)aom_malloc(0x8000);
          (pTVar15->gm_data).motion_models[0].inliers = piVar9;
          if (piVar9 == (int *)0x0) {
            aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                               "Failed to allocate gm_data->motion_models[m].inliers");
          }
        }
        lVar20 = lVar20 + -1;
        lVar21 = lVar21 + -0x1d0;
        lVar19 = lVar19 + -0x38;
      } while (1 < lVar20);
    }
  }
  pAVar10 = aom_get_worker_interface();
  if (0 < (int)uVar16) {
    lVar20 = uVar17 + 1;
    lVar19 = uVar17 * 0x38;
    do {
      pAVar18 = (cpi->mt_info).workers;
      *(undefined4 *)((long)&pAVar18[-1].had_error + lVar19) = 0;
      pAVar18 = (AVxWorker *)((long)&pAVar18[-1].impl_ + lVar19);
      if (lVar20 == 2) {
        (*pAVar10->execute)(pAVar18);
      }
      else {
        (*pAVar10->launch)(pAVar18);
      }
      lVar20 = lVar20 + -1;
      lVar19 = lVar19 + -0x38;
    } while (1 < lVar20);
  }
  pAVar10 = aom_get_worker_interface();
  pAVar18 = (cpi->mt_info).workers;
  iVar14 = pAVar18->had_error;
  if (iVar14 != 0) {
    memcpy(&local_1d0,(void *)((long)pAVar18->data1 + 0x18),0x1a0);
  }
  if (1 < (int)uVar16) {
    lVar20 = uVar17 + 1;
    lVar19 = uVar17 * 0x38;
    do {
      pAVar2 = (cpi->mt_info).workers;
      iVar7 = (*pAVar10->sync)((AVxWorker *)((long)&pAVar2[-1].impl_ + lVar19));
      if (iVar7 == 0) {
        memcpy(&local_1d0,(void *)(*(long *)((long)&pAVar2[-1].data1 + lVar19) + 0x18),0x1a0);
        iVar14 = 1;
      }
      lVar20 = lVar20 + -1;
      lVar19 = lVar19 + -0x38;
    } while (2 < lVar20);
  }
  if (iVar14 != 0) {
    aom_internal_error_copy((cpi->common).error,&local_1d0);
  }
  *(aom_internal_error_info **)(*(long *)((long)pAVar18->data1 + 8) + 0x2b90) = (cpi->common).error;
  if (0 < (int)uVar16) {
    lVar20 = 0;
    do {
      puVar3 = *(undefined1 **)
                ((((cpi->mt_info).tile_thr_data)->error_info).detail + lVar20 + -0x18);
      if ((ThreadData_conflict *)puVar3 != &cpi->td) {
        aom_free(*(void **)(puVar3 + 0x26e38));
        *(undefined8 *)(puVar3 + 0x26e38) = 0;
        aom_free(*(void **)(puVar3 + 0x26e28));
        *(undefined8 *)(puVar3 + 0x26e28) = 0;
      }
      lVar20 = lVar20 + 0x1d0;
    } while (uVar17 * 0x1d0 - lVar20 != 0);
  }
  return;
}

Assistant:

void av1_global_motion_estimation_mt(AV1_COMP *cpi) {
  GlobalMotionJobInfo *job_info = &cpi->mt_info.gm_sync.job_info;

  av1_zero(*job_info);

  int num_workers = compute_gm_workers(cpi);

  assign_thread_to_dir(job_info->thread_id_to_dir, num_workers);
  prepare_gm_workers(cpi, gm_mt_worker_hook, num_workers);
  launch_workers(&cpi->mt_info, num_workers);
  sync_enc_workers(&cpi->mt_info, &cpi->common, num_workers);
  gm_dealloc_thread_data(cpi, num_workers);
}